

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::String::String(String *this,VerySimpleReadOnlyString *b)

{
  uint uVar1;
  uchar *__dest;
  ulong __n;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  uVar1 = b->length;
  __n = (ulong)uVar1;
  if (-1 < (int)uVar1) {
    (this->super_tagbstring).mlen = (int)(__n + 1);
    (this->super_tagbstring).slen = uVar1;
    __dest = (uchar *)malloc(__n + 1);
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      if ((uVar1 != 0) && (b->data != (tCharPtr)0x0)) {
        memcpy(__dest,b->data,__n);
      }
      __dest[__n] = '\0';
      return;
    }
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
          "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
          ,0xcd,"Failure in block constructor");
  return;
}

Assistant:

String::String(const Strings::VerySimpleReadOnlyString & b)
    {
        slen = mlen = 0; data = 0;
        if (b.getLength() >= 0)
        {
            mlen = b.getLength() + 1;
            slen = b.getLength();
            data = (uint8 * ) malloc(mlen);
        }
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in block constructor");
        }
        else
        {
            if (slen > 0 && b.getData())    memcpy(data, b.getData(), slen);
            data[slen] = '\0';
        }
    }